

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall EDCircles::JoinCircles(EDCircles *this)

{
  int iVar1;
  Circle *pCVar2;
  BufferManager *pBVar3;
  Circle *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  void *__s;
  void *pvVar8;
  double *pdVar9;
  double *pdVar10;
  ulong __n;
  long lVar11;
  ulong uVar12;
  double *x;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double error;
  double r;
  double yc;
  double xc;
  EllipseEquation Eq;
  double local_158;
  double local_150;
  double local_128;
  double local_120;
  double local_118;
  double local_108;
  double local_f0;
  int *local_e8;
  size_t local_e0;
  EDCircles *local_d8;
  size_t local_d0;
  double local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  EllipseEquation local_a8;
  EllipseEquation local_68;
  
  sortCircle(this->circles2,this->noCircles2);
  iVar1 = this->noCircles2;
  __n = (ulong)iVar1;
  pCVar2 = this->circles2;
  if (0 < (long)__n) {
    pdVar9 = &pCVar2->minorAxisLength;
    sVar15 = __n;
    do {
      if (*(bool *)(pdVar9 + -2) == true) {
        ComputeEllipseCenterAndAxisLengths
                  ((EllipseEquation *)(pdVar9 + -10),(double *)(pdVar9 + -0x12),pdVar9 + -0x11,
                   pdVar9 + -1,pdVar9);
      }
      pdVar9 = pdVar9 + 0x13;
      sVar15 = sVar15 - 1;
    } while (sVar15 != 0);
  }
  sVar15 = __n;
  if (iVar1 < 0) {
    sVar15 = 0xffffffffffffffff;
  }
  __s = operator_new__(sVar15);
  if (0 < iVar1) {
    memset(__s,0,__n);
  }
  uVar12 = __n << 2;
  if (iVar1 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar12);
  if (0 < iVar1) {
    local_e8 = &this->noCircles3;
    pdVar9 = &pCVar2[1].minorAxisLength;
    uVar12 = 1;
    sVar15 = 0;
    local_e0 = __n;
    local_d8 = this;
    do {
      if (*(char *)((long)__s + sVar15) == '\0') {
        pCVar4 = pCVar2 + sVar15;
        if (pCVar2[sVar15].isEllipse == true) {
          local_158 = pCVar4->majorAxisLength;
          local_150 = pCVar4->minorAxisLength;
        }
        else {
          local_158 = pCVar4->r;
          local_150 = local_158;
        }
        uVar13 = 0;
        local_d0 = sVar15;
        if (sVar15 + 1 < __n) {
          uVar13 = 0;
          pdVar10 = pdVar9;
          uVar16 = uVar12;
          do {
            if (*(char *)((long)__s + uVar16) == '\0') {
              dVar19 = pCVar4->xc - ((Circle *)(pdVar10 + -0x12))->xc;
              dVar20 = pCVar4->yc - pdVar10[-0x11];
              dVar19 = dVar19 * dVar19 + dVar20 * dVar20;
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
              }
              else {
                dVar19 = SQRT(dVar19);
              }
              if (dVar19 <= 12.0) {
                if (*(bool *)(pdVar10 + -2) == true) {
                  dVar19 = *pdVar10;
                  dVar20 = pdVar10[-1];
                }
                else {
                  dVar19 = pdVar10[-0x10];
                  dVar20 = dVar19;
                }
                if ((ABS(local_158 - dVar20) <= 6.0) && (ABS(local_150 - dVar19) <= 6.0)) {
                  *(int *)((long)pvVar8 + (long)(int)uVar13 * 4) = (int)uVar16;
                  uVar13 = uVar13 + 1;
                }
              }
            }
            uVar16 = uVar16 + 1;
            pdVar10 = pdVar10 + 0x13;
          } while (__n != uVar16);
        }
        local_120 = pCVar4->xc;
        local_108 = pCVar4->yc;
        local_118 = pCVar4->r;
        local_128 = pCVar4->circleFitError;
        local_68.coeff[4] = 0.0;
        local_68.coeff[5] = 0.0;
        local_68.coeff[2] = 0.0;
        local_68.coeff[3] = 0.0;
        local_68.coeff[0] = 0.0;
        local_68.coeff[1] = 0.0;
        local_68.coeff[6] = 0.0;
        if ((int)uVar13 < 1) {
          bVar7 = false;
          bVar5 = false;
        }
        else {
          pBVar3 = this->bm;
          x = pBVar3->x + pBVar3->index;
          pdVar10 = pBVar3->y + pBVar3->index;
          uVar18 = (ulong)pCVar4->noPixels;
          memcpy(x,pCVar4->x,uVar18 << 3);
          memcpy(pdVar10,pCVar4->y,uVar18 << 3);
          local_c0 = (ulong)uVar13;
          uVar16 = 0;
          bVar5 = false;
          bVar7 = false;
          do {
            lVar11 = (long)*(int *)((long)pvVar8 + uVar16 * 4);
            uVar17 = (uint)uVar18;
            memcpy(x + (int)uVar17,pCVar2[lVar11].x,(long)pCVar2[lVar11].noPixels << 3);
            memcpy(pdVar10 + (int)uVar17,pCVar2[lVar11].y,(long)pCVar2[lVar11].noPixels << 3);
            uVar13 = uVar17 + pCVar2[lVar11].noPixels;
            bVar6 = true;
            if (((!bVar5) && (pCVar4->isEllipse == false)) && (pCVar2[lVar11].isEllipse == false)) {
              local_f0 = 10000000000.0;
              CircleFit(x,pdVar10,uVar13,local_a8.coeff,&local_b0,&local_b8,&local_f0);
              bVar6 = 2.0 < local_f0;
              if (!bVar6) {
                *(undefined1 *)((long)__s + lVar11) = 1;
                local_120 = local_a8.coeff[0];
                local_108 = local_b0;
                bVar7 = true;
                local_118 = local_b8;
                local_128 = local_f0;
              }
            }
            uVar14 = uVar13;
            if (bVar6) {
              local_a8.coeff[4] = 0.0;
              local_a8.coeff[5] = 0.0;
              local_a8.coeff[2] = 0.0;
              local_a8.coeff[3] = 0.0;
              local_a8.coeff[0] = 0.0;
              local_a8.coeff[1] = 0.0;
              local_a8.coeff[6] = 0.0;
              bVar6 = EllipseFit(x,pdVar10,uVar13,&local_a8,1);
              dVar19 = 10000000000.0;
              if (bVar6) {
                dVar19 = ComputeEllipseError(&local_a8,x,pdVar10,uVar13);
              }
              uVar14 = uVar17;
              if (dVar19 <= 2.0) {
                *(undefined1 *)((long)__s + lVar11) = 1;
                local_68.coeff[6] = local_a8.coeff[6];
                local_68.coeff[4] = local_a8.coeff[4];
                local_68.coeff[5] = local_a8.coeff[5];
                local_68.coeff[2] = local_a8.coeff[2];
                local_68.coeff[3] = local_a8.coeff[3];
                local_68.coeff[0] = local_a8.coeff[0];
                local_68.coeff[1] = local_a8.coeff[1];
                bVar5 = true;
                bVar7 = false;
                uVar14 = uVar13;
                local_c8 = dVar19;
              }
            }
            uVar16 = uVar16 + 1;
            uVar18 = (ulong)uVar14;
            __n = local_e0;
            this = local_d8;
          } while (local_c0 != uVar16);
        }
        sVar15 = local_d0;
        if (bVar7) {
          pCVar4 = this->circles3;
          iVar1 = this->noCircles3;
          pCVar4[iVar1].xc = local_120;
          pCVar4[iVar1].yc = local_108;
          pCVar4[iVar1].r = local_118;
          pCVar4[iVar1].circleFitError = local_128;
          pCVar4[iVar1].coverRatio = 0.0 / (local_118 * 6.283185307179586);
          pCVar4[iVar1].x = (double *)0x0;
          (&pCVar4[iVar1].x)[1] = (double *)0x0;
          pCVar4[iVar1].noPixels = 0;
          iVar1 = this->noCircles3;
          pCVar4[iVar1].isEllipse = false;
          this->noCircles3 = iVar1 + 1;
        }
        else if (bVar5) {
          addCircle(this->circles3,local_e8,local_120,local_108,local_118,local_128,&local_68,
                    local_c8,(double *)0x0,(double *)0x0,0);
        }
        else {
          memcpy(this->circles3 + this->noCircles3,pCVar4,0x98);
          this->noCircles3 = this->noCircles3 + 1;
        }
      }
      sVar15 = sVar15 + 1;
      uVar12 = uVar12 + 1;
      pdVar9 = pdVar9 + 0x13;
    } while (sVar15 != __n);
  }
  operator_delete__(__s);
  operator_delete__(pvVar8);
  return;
}

Assistant:

void EDCircles::JoinCircles()
{
	// Sort the circles wrt their radius
	sortCircle(circles2, noCircles2);

	int noCircles = noCircles2;
	Circle *circles = circles2;

	for (int i = 0; i<noCircles; i++) {
		if (circles[i].isEllipse) {
			ComputeEllipseCenterAndAxisLengths(&circles[i].eq, &circles[i].xc, &circles[i].yc, &circles[i].majorAxisLength, &circles[i].minorAxisLength);
		} //end-if
	} //end-for

	bool *taken = new bool[noCircles];
	for (int i = 0; i<noCircles; i++) taken[i] = false;

	int *candidateCircles = new int[noCircles];
	int noCandidateCircles;

	for (int i = 0; i<noCircles; i++) {
		if (taken[i]) continue;

		// Current arc
		double majorAxisLength, minorAxisLength;

		if (circles[i].isEllipse) {
			majorAxisLength = circles[i].majorAxisLength;
			minorAxisLength = circles[i].minorAxisLength;

		}
		else {
			majorAxisLength = circles[i].r;
			minorAxisLength = circles[i].r;
		} //end-else

		  // Find other circles to join with
		noCandidateCircles = 0;

		for (int j = i + 1; j<noCircles; j++) {
			if (taken[j]) continue;

#define JOINED_SHORT_ARC_ERROR_THRESHOLD  2 // 2.5
#define AXIS_LENGTH_DIFF_THRESHOLD     6 //(JOINED_SHORT_ARC_ERROR_THRESHOLD*2+1)
#define CENTER_DISTANCE_THRESHOLD      12 //(AXIS_LENGTH_DIFF_THRESHOLD*2)

			double dx = circles[i].xc - circles[j].xc;
			double dy = circles[i].yc - circles[j].yc;
			double centerDistance = sqrt(dx*dx + dy*dy);
			if (centerDistance > CENTER_DISTANCE_THRESHOLD) continue;

			double diff1, diff2;
			if (circles[j].isEllipse) {
				diff1 = fabs(majorAxisLength - circles[j].majorAxisLength);
				diff2 = fabs(minorAxisLength - circles[j].minorAxisLength);

			}
			else {
				diff1 = fabs(majorAxisLength - circles[j].r);
				diff2 = fabs(minorAxisLength - circles[j].r);
			} //end-else

			if (diff1 > AXIS_LENGTH_DIFF_THRESHOLD) continue;
			if (diff2 > AXIS_LENGTH_DIFF_THRESHOLD) continue;

			// Add to candidates
			candidateCircles[noCandidateCircles] = j;
			noCandidateCircles++;
		} //end-for

		  // Try to join the current arc with the candidate arc (if there is one)
		double XC = circles[i].xc;
		double YC = circles[i].yc;
		double R = circles[i].r;

		double CircleFitError = circles[i].circleFitError;
		bool CircleFitValid = false;

		EllipseEquation Eq;
		double EllipseFitError;
		bool EllipseFitValid = false;

		if (noCandidateCircles > 0) {
			int noPixels = circles[i].noPixels;
			double *x = bm->getX();
			double *y = bm->getY();
			memcpy(x, circles[i].x, noPixels * sizeof(double));
			memcpy(y, circles[i].y, noPixels * sizeof(double));

			for (int j = 0; j<noCandidateCircles; j++) {
				int CandidateArcNo = candidateCircles[j];

				int noPixelsSave = noPixels;
				memcpy(x + noPixels, circles[CandidateArcNo].x, circles[CandidateArcNo].noPixels * sizeof(double));
				memcpy(y + noPixels, circles[CandidateArcNo].y, circles[CandidateArcNo].noPixels * sizeof(double));
				noPixels += circles[CandidateArcNo].noPixels;

				bool circleFitOK = false;
				if (EllipseFitValid == false && circles[i].isEllipse == false && circles[CandidateArcNo].isEllipse == false) {
					double xc, yc, r, error = 1e10;
					CircleFit(x, y, noPixels, &xc, &yc, &r, &error);

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						XC = xc;
						YC = yc;
						R = r;
						CircleFitError = error;

						circleFitOK = true;
						CircleFitValid = true;
					} //end-if
				} // end-if

				bool ellipseFitOK = false;
				if (circleFitOK == false) {
					// Try to fit an ellipse
					double error = 1e10;
					EllipseEquation eq;
					if (EllipseFit(x, y, noPixels, &eq)) {
						error = ComputeEllipseError(&eq, x, y, noPixels);
					} //end-if

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						Eq = eq;
						EllipseFitError = error;

						ellipseFitOK = true;
						EllipseFitValid = true;
						CircleFitValid = false;
					} // end-if
				} //end-if

				if (circleFitOK == false && ellipseFitOK == false) {
					noPixels = noPixelsSave;
				} //end-if
			} // end-for
		} //end-if

		// Add the new circle/ellipse to circles2
		if (CircleFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, NULL, NULL, 0);

		}
		else if (EllipseFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, &Eq, EllipseFitError, NULL, NULL, 0);

		}
		else {
			circles3[noCircles3] = circles[i];
			noCircles3++;
		} //end-else
	} //end-for

	delete[] taken;
	delete[] candidateCircles;
}